

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O1

void __thiscall CLOptions::CLOptions(CLOptions *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_CLOptions = (_func_int **)&PTR__CLOptions_00113c58;
  (this->longopts).super__Vector_base<option,_std::allocator<option>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->longopts).super__Vector_base<option,_std::allocator<option>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->longopts).super__Vector_base<option,_std::allocator<option>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->params_bools)._M_t._M_impl.super__Rb_tree_header;
  (this->params_bools)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->params_bools)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->params_bools)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->params_bools)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->params_bools)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->params_doubles)._M_t._M_impl.super__Rb_tree_header;
  (this->params_doubles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->params_doubles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->params_doubles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->params_doubles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->params_doubles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->params_ints)._M_t._M_impl.super__Rb_tree_header;
  (this->params_ints)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->params_ints)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->params_ints)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->params_ints)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->params_ints)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->params_strings)._M_t._M_impl.super__Rb_tree_header;
  (this->params_strings)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->params_strings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->params_strings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->params_strings)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->params_strings)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->help_str)._M_dataplus._M_p = (pointer)&(this->help_str).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->help_str,"help","");
  (this->version_str)._M_dataplus._M_p = (pointer)&(this->version_str).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->version_str,"version","");
  (this->configfile_opt_name)._M_dataplus._M_p = (pointer)&(this->configfile_opt_name).field_2;
  (this->configfile_opt_name)._M_string_length = 0;
  (this->configfile_opt_name).field_2._M_local_buf[0] = '\0';
  (this->configfile_comment)._M_dataplus._M_p = (pointer)&(this->configfile_comment).field_2;
  (this->configfile_comment)._M_string_length = 0;
  (this->configfile_comment).field_2._M_local_buf[0] = '\0';
  (this->version_opt).
  super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  _vptr_CLParam = (_func_int **)&PTR__CLParam_00113cc8;
  (this->version_opt).
  super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  parameter_name._M_dataplus._M_p =
       (pointer)&(this->version_opt).
                 super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .parameter_name.field_2;
  (this->version_opt).
  super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  parameter_name._M_string_length = 0;
  (this->version_opt).
  super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  parameter_name.field_2._M_local_buf[0] = '\0';
  (this->version_opt).
  super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  parameter_name_short = '\0';
  (this->version_opt).
  super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  description._M_dataplus._M_p =
       (pointer)&(this->version_opt).
                 super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .description.field_2;
  (this->version_opt).
  super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  description._M_string_length = 0;
  (this->version_opt).
  super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  description.field_2._M_local_buf[0] = '\0';
  (this->version_opt).
  super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  value._M_dataplus._M_p =
       (pointer)&(this->version_opt).
                 super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .value.field_2;
  (this->version_opt).
  super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  value._M_string_length = 0;
  (this->version_opt).
  super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  value.field_2._M_local_buf[0] = '\0';
  (this->version_opt).
  super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  default_value._M_dataplus._M_p =
       (pointer)&(this->version_opt).
                 super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .default_value.field_2;
  (this->version_opt).
  super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  default_value._M_string_length = 0;
  (this->version_opt).
  super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  default_value.field_2._M_local_buf[0] = '\0';
  (this->version_opt).
  super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  _vptr_CLParam = (_func_int **)&PTR__CLParam_00113c78;
  (this->program_desc_)._M_dataplus._M_p = (pointer)&(this->program_desc_).field_2;
  (this->program_desc_)._M_string_length = 0;
  (this->program_desc_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

virtual ~CLOptions()
    {
        // Loop through each storage map and delete all objects
        std::map<std::string, CLBool*>::iterator bool_itr ;
        for (bool_itr=params_bools.begin(); bool_itr!=params_bools.end(); ++bool_itr)
            if (bool_itr->second != 0) delete bool_itr->second ;
        
        std::map<std::string, CLDouble*>::iterator dbl_itr;
        for (dbl_itr=params_doubles.begin(); dbl_itr!=params_doubles.end(); ++dbl_itr)
            if (dbl_itr->second != 0) delete dbl_itr->second ;
        
        std::map<std::string, CLInt*>::iterator int_itr;
        for (int_itr=params_ints.begin(); int_itr!=params_ints.end(); ++int_itr)
            if (int_itr->second != 0) delete int_itr->second ;
        
        std::map<std::string, CLString*>::iterator str_itr ;
        for (str_itr=params_strings.begin(); str_itr!=params_strings.end(); ++str_itr)
            if (str_itr->second != 0) delete str_itr->second ;
    }